

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeProfileInfo.cpp
# Opt level: O0

void JITTimeProfileInfo::InitializeJITProfileData
               (ArenaAllocator *alloc,DynamicProfileInfo *profileInfo,FunctionBody *functionBody,
               ProfileDataIDL *data,bool isForegroundJIT)

{
  ushort uVar1;
  code *pcVar2;
  SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *this;
  DynamicProfileInfo *pDVar3;
  bool bVar4;
  ImplicitCallFlags IVar5;
  ProfileId PVar6;
  ArgSlot AVar7;
  uint uVar8;
  ThisInfo TVar9;
  JITManager *this_00;
  LdLenIDL *pLVar10;
  LdElemInfo *pLVar11;
  StElemInfo *pSVar12;
  LdLenInfo *src;
  LdElemIDL *pLVar13;
  StElemIDL *pSVar14;
  ArrayCallSiteIDL *pAVar15;
  ArrayCallSiteInfo *pAVar16;
  FldInfo *pFVar17;
  CallSiteIDL *pCVar18;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar19;
  CallbackInfoIDL *pCVar20;
  undefined4 *puVar21;
  SListNodeBase<Memory::Recycler> **ppSVar22;
  WriteBarrierPtr *this_01;
  CallbackInfo **ppCVar23;
  BVFixedIDL *pBVar24;
  ValueType *pVVar25;
  ImplicitCallFlags *pIVar26;
  ulong uVar27;
  CallbackInfo *info;
  undefined1 auStack_150 [6];
  ProfileId callbackInfoIndex;
  Iterator iter;
  TrackAllocData local_130;
  CallbackInfoList *local_108;
  CallbackInfoList *callbackInfoList;
  code *local_f8;
  undefined8 local_f0;
  TrackAllocData local_e8;
  code *local_c0;
  undefined8 local_b8;
  TrackAllocData local_b0;
  code *local_88;
  undefined8 local_80;
  TrackAllocData local_78;
  byte local_49;
  ProfileDataIDL *pPStack_48;
  bool isForegroundJIT_local;
  ProfileDataIDL *data_local;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *profileInfo_local;
  ArenaAllocator *alloc_local;
  SListNodeBase<Memory::Recycler> local_20;
  undefined1 *local_18;
  bool local_9;
  
  if (profileInfo != (DynamicProfileInfo *)0x0) {
    local_49 = isForegroundJIT;
    pPStack_48 = data;
    data_local = (ProfileDataIDL *)functionBody;
    functionBody_local = (FunctionBody *)profileInfo;
    profileInfo_local = (DynamicProfileInfo *)alloc;
    PVar6 = Js::FunctionBody::GetProfiledLdLenCount(functionBody);
    pPStack_48->profiledLdLenCount = PVar6;
    PVar6 = Js::FunctionBody::GetProfiledLdElemCount((FunctionBody *)data_local);
    pPStack_48->profiledLdElemCount = PVar6;
    PVar6 = Js::FunctionBody::GetProfiledStElemCount((FunctionBody *)data_local);
    pPStack_48->profiledStElemCount = PVar6;
    this_00 = JITManager::GetJITManager();
    bVar4 = JITManager::IsOOPJITEnabled(this_00);
    pDVar3 = profileInfo_local;
    if ((bVar4) || ((local_49 & 1) != 0)) {
      pLVar10 = (LdLenIDL *)
                Js::DynamicProfileInfo::GetLdLenInfo((DynamicProfileInfo *)functionBody_local);
      pPStack_48->ldLenData = pLVar10;
      pLVar11 = Js::DynamicProfileInfo::GetLdElemInfo((DynamicProfileInfo *)functionBody_local);
      pPStack_48->ldElemData = (LdElemIDL *)pLVar11;
      pSVar12 = Js::DynamicProfileInfo::GetStElemInfo((DynamicProfileInfo *)functionBody_local);
      pPStack_48->stElemData = (StElemIDL *)pSVar12;
    }
    else {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_78,(type_info *)&LdLenIDL::typeinfo,0,(ulong)pPStack_48->profiledLdLenCount,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                 ,0x2d);
      pAVar19 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pDVar3,&local_78);
      local_88 = Memory::ArenaAllocator::Alloc;
      local_80 = 0;
      pLVar10 = Memory::AllocateArray<Memory::ArenaAllocator,LdLenIDL,false>
                          ((Memory *)pAVar19,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                           (ulong)pPStack_48->profiledLdLenCount);
      pPStack_48->ldLenData = pLVar10;
      pLVar10 = pPStack_48->ldLenData;
      uVar1 = pPStack_48->profiledLdLenCount;
      src = Js::DynamicProfileInfo::GetLdLenInfo((DynamicProfileInfo *)functionBody_local);
      PVar6 = Js::FunctionBody::GetProfiledLdLenCount((FunctionBody *)data_local);
      memcpy_s(pLVar10,(ulong)uVar1 << 2,src,(ulong)PVar6 << 2);
      pDVar3 = profileInfo_local;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_b0,(type_info *)&LdElemIDL::typeinfo,0,
                 (ulong)pPStack_48->profiledLdElemCount,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                 ,0x35);
      pAVar19 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pDVar3,&local_b0);
      local_c0 = Memory::ArenaAllocator::Alloc;
      local_b8 = 0;
      pLVar13 = Memory::AllocateArray<Memory::ArenaAllocator,LdElemIDL,false>
                          ((Memory *)pAVar19,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                           (ulong)pPStack_48->profiledLdElemCount);
      pPStack_48->ldElemData = pLVar13;
      pLVar13 = pPStack_48->ldElemData;
      uVar1 = pPStack_48->profiledLdElemCount;
      pLVar11 = Js::DynamicProfileInfo::GetLdElemInfo((DynamicProfileInfo *)functionBody_local);
      PVar6 = Js::FunctionBody::GetProfiledLdElemCount((FunctionBody *)data_local);
      memcpy_s(pLVar13,(ulong)((uint)uVar1 * 2) * 3,pLVar11,(ulong)((uint)PVar6 * 2) * 3);
      pDVar3 = profileInfo_local;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_e8,(type_info *)&StElemIDL::typeinfo,0,
                 (ulong)pPStack_48->profiledStElemCount,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                 ,0x3d);
      pAVar19 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pDVar3,&local_e8);
      local_f8 = Memory::ArenaAllocator::Alloc;
      local_f0 = 0;
      pSVar14 = Memory::AllocateArray<Memory::ArenaAllocator,StElemIDL,false>
                          ((Memory *)pAVar19,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                           (ulong)pPStack_48->profiledStElemCount);
      pPStack_48->stElemData = pSVar14;
      pSVar14 = pPStack_48->stElemData;
      uVar1 = pPStack_48->profiledStElemCount;
      pSVar12 = Js::DynamicProfileInfo::GetStElemInfo((DynamicProfileInfo *)functionBody_local);
      PVar6 = Js::FunctionBody::GetProfiledStElemCount((FunctionBody *)data_local);
      memcpy_s(pSVar14,(ulong)uVar1 << 2,pSVar12,(ulong)PVar6 << 2);
    }
    PVar6 = Js::FunctionBody::GetProfiledArrayCallSiteCount((FunctionBody *)data_local);
    pPStack_48->profiledArrayCallSiteCount = PVar6;
    pAVar15 = (ArrayCallSiteIDL *)
              Js::DynamicProfileInfo::GetArrayCallSiteInfo((DynamicProfileInfo *)functionBody_local)
    ;
    pPStack_48->arrayCallSiteData = pAVar15;
    pAVar16 = Js::DynamicProfileInfo::GetArrayCallSiteInfo((DynamicProfileInfo *)functionBody_local)
    ;
    pPStack_48->arrayCallSiteDataAddr = (long)pAVar16;
    uVar8 = Js::FunctionBody::GetProfiledFldCount((FunctionBody *)data_local);
    pPStack_48->inlineCacheCount = uVar8;
    pFVar17 = Js::DynamicProfileInfo::GetFldInfo((DynamicProfileInfo *)functionBody_local);
    pPStack_48->fldData = (FldIDL *)pFVar17;
    pFVar17 = Js::DynamicProfileInfo::GetFldInfo((DynamicProfileInfo *)functionBody_local);
    pPStack_48->fldDataAddr = (long)pFVar17;
    TVar9 = Js::DynamicProfileInfo::GetThisInfo((DynamicProfileInfo *)functionBody_local);
    callbackInfoList._4_3_ = TVar9._0_3_;
    pPStack_48->thisData = callbackInfoList._4_4_;
    PVar6 = Js::FunctionBody::GetProfiledCallSiteCount((FunctionBody *)data_local);
    pPStack_48->profiledCallSiteCount = PVar6;
    pCVar18 = (CallSiteIDL *)
              Js::DynamicProfileInfo::GetCallSiteInfo((DynamicProfileInfo *)functionBody_local);
    pPStack_48->callSiteData = pCVar18;
    local_108 = Js::FunctionBody::GetCallbackInfoListWithLock((FunctionBody *)data_local);
    if (local_108 == (CallbackInfoList *)0x0) {
      pPStack_48->profiledCallbackCount = 0;
    }
    else {
      uVar8 = RealCount::Count(&(local_108->
                                super_SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>).
                                super_RealCount);
      pDVar3 = profileInfo_local;
      pPStack_48->profiledCallbackCount = (unsigned_short)uVar8;
      if (pPStack_48->profiledCallbackCount != 0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_130,(type_info *)&CallbackInfoIDL::typeinfo,0,
                   (ulong)pPStack_48->profiledCallbackCount,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                   ,0x62);
        pAVar19 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pDVar3,&local_130);
        iter.current = (NodeBase *)Memory::ArenaAllocator::AllocZero;
        pCVar20 = Memory::AllocateArray<Memory::ArenaAllocator,CallbackInfoIDL,false>
                            ((Memory *)pAVar19,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0
                             ,(ulong)pPStack_48->profiledCallbackCount);
        pPStack_48->callbackData = pCVar20;
        _auStack_150 = SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::GetIterator
                                 (&local_108->
                                   super_SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>)
        ;
        for (info._6_2_ = 0; info._6_2_ < pPStack_48->profiledCallbackCount;
            info._6_2_ = info._6_2_ + 1) {
          local_18 = auStack_150;
          if (iter.list == (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar21 = 0;
          }
          this = _auStack_150;
          SListNodeBase<Memory::Recycler>::Next(&local_20);
          ppSVar22 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                               ((WriteBarrierPtr *)&local_20);
          bVar4 = SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::IsHead(this,*ppSVar22)
          ;
          if (!bVar4) {
            SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)&alloc_local);
            Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                      ((WriteBarrierPtr *)&alloc_local);
          }
          local_9 = !bVar4;
          this_01 = (WriteBarrierPtr *)
                    SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                              ((Iterator *)auStack_150);
          ppCVar23 = Memory::WriteBarrierPtr::operator_cast_to_CallbackInfo__(this_01);
          memcpy_s(pPStack_48->callbackData + info._6_2_,0xc,*ppCVar23,0xc);
        }
      }
    }
    pBVar24 = (BVFixedIDL *)
              Js::DynamicProfileInfo::GetLoopFlags((DynamicProfileInfo *)functionBody_local);
    pPStack_48->loopFlags = pBVar24;
    PVar6 = Js::FunctionBody::GetProfiledSlotCount((FunctionBody *)data_local);
    pPStack_48->profiledSlotCount = PVar6;
    pVVar25 = Js::DynamicProfileInfo::GetSlotInfo((DynamicProfileInfo *)functionBody_local);
    pPStack_48->slotData = (unsigned_short *)pVVar25;
    PVar6 = Js::FunctionBody::GetProfiledReturnTypeCount((FunctionBody *)data_local);
    pPStack_48->profiledReturnTypeCount = PVar6;
    pVVar25 = Js::DynamicProfileInfo::GetReturnTypeInfo((DynamicProfileInfo *)functionBody_local);
    pPStack_48->returnTypeData = (unsigned_short *)pVVar25;
    PVar6 = Js::FunctionBody::GetProfiledDivOrRemCount((FunctionBody *)data_local);
    pPStack_48->profiledDivOrRemCount = PVar6;
    pVVar25 = Js::DynamicProfileInfo::GetDivideTypeInfo((DynamicProfileInfo *)functionBody_local);
    pPStack_48->divideTypeInfo = (unsigned_short *)pVVar25;
    PVar6 = Js::FunctionBody::GetProfiledSwitchCount((FunctionBody *)data_local);
    pPStack_48->profiledSwitchCount = PVar6;
    pVVar25 = Js::DynamicProfileInfo::GetSwitchTypeInfo((DynamicProfileInfo *)functionBody_local);
    pPStack_48->switchTypeInfo = (unsigned_short *)pVVar25;
    AVar7 = Js::FunctionBody::GetProfiledInParamsCount((FunctionBody *)data_local);
    pPStack_48->profiledInParamsCount = AVar7;
    pVVar25 = Js::DynamicProfileInfo::GetParameterInfo((DynamicProfileInfo *)functionBody_local);
    pPStack_48->parameterInfo = (unsigned_short *)pVVar25;
    uVar8 = Js::FunctionBody::GetLoopCount((FunctionBody *)data_local);
    pPStack_48->loopCount = uVar8;
    pIVar26 = Js::DynamicProfileInfo::GetLoopImplicitCallFlags
                        ((DynamicProfileInfo *)functionBody_local);
    pPStack_48->loopImplicitCallFlags = pIVar26;
    IVar5 = Js::DynamicProfileInfo::GetImplicitCallFlags((DynamicProfileInfo *)functionBody_local);
    pPStack_48->implicitCallFlags = IVar5;
    pPStack_48->flags = 0;
    bVar4 = Js::DynamicProfileInfo::IsAggressiveIntTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    pPStack_48->flags = (ulong)bVar4 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsAggressiveIntTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 2;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsAggressiveMulIntTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 4;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsAggressiveMulIntTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 8;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsDivIntTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x10;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsDivIntTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x20;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsLossyIntTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x40;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsTrackCompoundedIntOverflowDisabled
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x80;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsFloatTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x100;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsArrayCheckHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x200;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsArrayCheckHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x400;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsArrayMissingValueCheckHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x800;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsArrayMissingValueCheckHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x1000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsJsArraySegmentHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x2000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsJsArraySegmentHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x4000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsArrayLengthHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x8000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsArrayLengthHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x10000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsTypedArrayTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x20000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsTypedArrayTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x40000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsLdLenIntSpecDisabled((DynamicProfileInfo *)functionBody_local)
    ;
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x80000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsBoundCheckHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x100000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsBoundCheckHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x200000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsLoopCountBasedBoundCheckHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,false);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x400000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsLoopCountBasedBoundCheckHoistDisabled
                      ((DynamicProfileInfo *)functionBody_local,true);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x800000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsFloorInliningDisabled
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x1000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsNoProfileBailoutsDisabled
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x2000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsSwitchOptDisabled((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x4000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsEquivalentObjTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x8000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsObjTypeSpecDisabledInJitLoopBody
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x10000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsMemOpDisabled((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x20000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsCheckThisDisabled((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x40000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::HasLdFldCallSiteInfo((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x80000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsStackArgOptDisabled((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x100000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsLoopImplicitCallInfoDisabled
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x200000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsPowIntIntTypeSpecDisabled
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x400000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsTagCheckDisabled((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x800000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsOptimizeTryFinallyDisabled
                      ((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x1000000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
    bVar4 = Js::DynamicProfileInfo::IsFieldPREDisabled((DynamicProfileInfo *)functionBody_local);
    uVar27 = 0;
    if (bVar4) {
      uVar27 = 0x2000000000;
    }
    pPStack_48->flags = uVar27 | pPStack_48->flags;
  }
  return;
}

Assistant:

void
JITTimeProfileInfo::InitializeJITProfileData(
    __in ArenaAllocator * alloc,
    __in Js::DynamicProfileInfo * profileInfo,
    __in Js::FunctionBody *functionBody,
    __out ProfileDataIDL * data,
    bool isForegroundJIT)
{
    if (profileInfo == nullptr)
    {
        return;
    }

    CompileAssert(sizeof(LdLenIDL) == sizeof(Js::LdLenInfo));
    CompileAssert(sizeof(LdElemIDL) == sizeof(Js::LdElemInfo));
    CompileAssert(sizeof(StElemIDL) == sizeof(Js::StElemInfo));

    data->profiledLdLenCount = functionBody->GetProfiledLdLenCount();
    data->profiledLdElemCount = functionBody->GetProfiledLdElemCount();
    data->profiledStElemCount = functionBody->GetProfiledStElemCount();

    if (JITManager::GetJITManager()->IsOOPJITEnabled() || isForegroundJIT)
    {
        data->ldLenData = (LdLenIDL*)profileInfo->GetLdLenInfo();
        data->ldElemData = (LdElemIDL*)profileInfo->GetLdElemInfo();
        data->stElemData = (StElemIDL*)profileInfo->GetStElemInfo();
    }
    else
    {
        // for in-proc background JIT we need to explicitly copy LdLen, LdElem, and StElem info
        data->ldLenData = AnewArray(alloc, LdLenIDL, data->profiledLdLenCount);
        memcpy_s(
            data->ldLenData,
            data->profiledLdLenCount * sizeof(LdLenIDL),
            profileInfo->GetLdLenInfo(),
            functionBody->GetProfiledLdLenCount() * sizeof(Js::LdLenInfo)
        );

        data->ldElemData = AnewArray(alloc, LdElemIDL, data->profiledLdElemCount);
        memcpy_s(
            data->ldElemData,
            data->profiledLdElemCount * sizeof(LdElemIDL),
            profileInfo->GetLdElemInfo(),
            functionBody->GetProfiledLdElemCount() * sizeof(Js::LdElemInfo)
        );

        data->stElemData = AnewArray(alloc, StElemIDL, data->profiledStElemCount);
        memcpy_s(
            data->stElemData,
            data->profiledStElemCount * sizeof(StElemIDL),
            profileInfo->GetStElemInfo(),
            functionBody->GetProfiledStElemCount() * sizeof(Js::StElemInfo)
        );
    }

    CompileAssert(sizeof(ArrayCallSiteIDL) == sizeof(Js::ArrayCallSiteInfo));
    data->profiledArrayCallSiteCount = functionBody->GetProfiledArrayCallSiteCount();
    data->arrayCallSiteData = (ArrayCallSiteIDL*)profileInfo->GetArrayCallSiteInfo();
    data->arrayCallSiteDataAddr = (intptr_t)profileInfo->GetArrayCallSiteInfo();

    CompileAssert(sizeof(FldIDL) == sizeof(Js::FldInfo));
    data->inlineCacheCount = functionBody->GetProfiledFldCount();
    data->fldData = (FldIDL*)profileInfo->GetFldInfo();
    data->fldDataAddr = (intptr_t)profileInfo->GetFldInfo();

    CompileAssert(sizeof(ThisIDL) == sizeof(Js::ThisInfo));
    data->thisData = *reinterpret_cast<ThisIDL*>(&profileInfo->GetThisInfo());

    CompileAssert(sizeof(CallSiteIDL) == sizeof(Js::CallSiteInfo));
    data->profiledCallSiteCount = functionBody->GetProfiledCallSiteCount();
    data->callSiteData = reinterpret_cast<CallSiteIDL*>(profileInfo->GetCallSiteInfo());

    CompileAssert(sizeof(CallbackInfoIDL) == sizeof(Js::CallbackInfo));
    Js::CallbackInfoList * callbackInfoList = functionBody->GetCallbackInfoListWithLock();
    if (callbackInfoList == nullptr)
    {
        data->profiledCallbackCount = 0;
    }
    else
    {
        data->profiledCallbackCount = static_cast<Js::ProfileId>(callbackInfoList->Count());
        if (data->profiledCallbackCount > 0)
        {
            data->callbackData = AnewArrayZ(alloc, CallbackInfoIDL, data->profiledCallbackCount);
            Js::CallbackInfoList::Iterator iter = callbackInfoList->GetIterator();
            for (Js::ProfileId callbackInfoIndex = 0; callbackInfoIndex < data->profiledCallbackCount; ++callbackInfoIndex)
            {
                iter.Next();
                Js::CallbackInfo * info = iter.Data();
                memcpy_s(
                    &data->callbackData[callbackInfoIndex],
                    sizeof(CallbackInfoIDL),
                    info,
                    sizeof(Js::CallbackInfo)
                );
            }
        }
    }

    CompileAssert(sizeof(BVUnitIDL) == sizeof(BVUnit));
    data->loopFlags = (BVFixedIDL*)profileInfo->GetLoopFlags();

    CompileAssert(sizeof(ValueType) == sizeof(uint16));

    data->profiledSlotCount = functionBody->GetProfiledSlotCount();
    data->slotData = reinterpret_cast<uint16*>(profileInfo->GetSlotInfo());

    data->profiledReturnTypeCount = functionBody->GetProfiledReturnTypeCount();
    data->returnTypeData = reinterpret_cast<uint16*>(profileInfo->GetReturnTypeInfo());

    data->profiledDivOrRemCount = functionBody->GetProfiledDivOrRemCount();
    data->divideTypeInfo = reinterpret_cast<uint16*>(profileInfo->GetDivideTypeInfo());

    data->profiledSwitchCount = functionBody->GetProfiledSwitchCount();
    data->switchTypeInfo = reinterpret_cast<uint16*>(profileInfo->GetSwitchTypeInfo());

    data->profiledInParamsCount = functionBody->GetProfiledInParamsCount();
    data->parameterInfo = reinterpret_cast<uint16*>(profileInfo->GetParameterInfo());

    data->loopCount = functionBody->GetLoopCount();
    data->loopImplicitCallFlags = reinterpret_cast<byte*>(profileInfo->GetLoopImplicitCallFlags());

    data->implicitCallFlags = static_cast<byte>(profileInfo->GetImplicitCallFlags());

    data->flags = 0;
    data->flags |= profileInfo->IsAggressiveIntTypeSpecDisabled(false) ? Flags_disableAggressiveIntTypeSpec : 0;
    data->flags |= profileInfo->IsAggressiveIntTypeSpecDisabled(true) ? Flags_disableAggressiveIntTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsAggressiveMulIntTypeSpecDisabled(false) ? Flags_disableAggressiveMulIntTypeSpec : 0;
    data->flags |= profileInfo->IsAggressiveMulIntTypeSpecDisabled(true) ? Flags_disableAggressiveMulIntTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsDivIntTypeSpecDisabled(false) ? Flags_disableDivIntTypeSpec : 0;
    data->flags |= profileInfo->IsDivIntTypeSpecDisabled(true) ? Flags_disableDivIntTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsLossyIntTypeSpecDisabled() ? Flags_disableLossyIntTypeSpec : 0;
    data->flags |= profileInfo->IsTrackCompoundedIntOverflowDisabled() ? Flags_disableTrackCompoundedIntOverflow : 0;
    data->flags |= profileInfo->IsFloatTypeSpecDisabled() ? Flags_disableFloatTypeSpec : 0;
    data->flags |= profileInfo->IsArrayCheckHoistDisabled(false) ? Flags_disableArrayCheckHoist : 0;
    data->flags |= profileInfo->IsArrayCheckHoistDisabled(true) ? Flags_disableArrayCheckHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsArrayMissingValueCheckHoistDisabled(false) ? Flags_disableArrayMissingValueCheckHoist : 0;
    data->flags |= profileInfo->IsArrayMissingValueCheckHoistDisabled(true) ? Flags_disableArrayMissingValueCheckHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsJsArraySegmentHoistDisabled(false) ? Flags_disableJsArraySegmentHoist : 0;
    data->flags |= profileInfo->IsJsArraySegmentHoistDisabled(true) ? Flags_disableJsArraySegmentHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsArrayLengthHoistDisabled(false) ? Flags_disableArrayLengthHoist : 0;
    data->flags |= profileInfo->IsArrayLengthHoistDisabled(true) ? Flags_disableArrayLengthHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsTypedArrayTypeSpecDisabled(false) ? Flags_disableTypedArrayTypeSpec : 0;
    data->flags |= profileInfo->IsTypedArrayTypeSpecDisabled(true) ? Flags_disableTypedArrayTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsLdLenIntSpecDisabled() ? Flags_disableLdLenIntSpec : 0;
    data->flags |= profileInfo->IsBoundCheckHoistDisabled(false) ? Flags_disableBoundCheckHoist : 0;
    data->flags |= profileInfo->IsBoundCheckHoistDisabled(true) ? Flags_disableBoundCheckHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsLoopCountBasedBoundCheckHoistDisabled(false) ? Flags_disableLoopCountBasedBoundCheckHoist : 0;
    data->flags |= profileInfo->IsLoopCountBasedBoundCheckHoistDisabled(true) ? Flags_disableLoopCountBasedBoundCheckHoist_jitLoopBody : 0;
    data->flags |= profileInfo->IsFloorInliningDisabled() ? Flags_disableFloorInlining : 0;
    data->flags |= profileInfo->IsNoProfileBailoutsDisabled() ? Flags_disableNoProfileBailouts : 0;
    data->flags |= profileInfo->IsSwitchOptDisabled() ? Flags_disableSwitchOpt : 0;
    data->flags |= profileInfo->IsEquivalentObjTypeSpecDisabled() ? Flags_disableEquivalentObjTypeSpec : 0;
    data->flags |= profileInfo->IsObjTypeSpecDisabledInJitLoopBody() ? Flags_disableObjTypeSpec_jitLoopBody : 0;
    data->flags |= profileInfo->IsMemOpDisabled() ? Flags_disableMemOp : 0;
    data->flags |= profileInfo->IsCheckThisDisabled() ? Flags_disableCheckThis : 0;
    data->flags |= profileInfo->HasLdFldCallSiteInfo() ? Flags_hasLdFldCallSiteInfo : 0;
    data->flags |= profileInfo->IsStackArgOptDisabled() ? Flags_disableStackArgOpt : 0;
    data->flags |= profileInfo->IsLoopImplicitCallInfoDisabled() ? Flags_disableLoopImplicitCallInfo : 0;
    data->flags |= profileInfo->IsPowIntIntTypeSpecDisabled() ? Flags_disablePowIntIntTypeSpec : 0;
    data->flags |= profileInfo->IsTagCheckDisabled() ? Flags_disableTagCheck : 0;
    data->flags |= profileInfo->IsOptimizeTryFinallyDisabled() ? Flags_disableOptimizeTryFinally : 0;
    data->flags |= profileInfo->IsFieldPREDisabled() ? Flags_disableFieldPRE : 0;
}